

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::~DeviceContextVkImpl(DeviceContextVkImpl *this)

{
  undefined *puVar1;
  bool bVar2;
  undefined8 uVar3;
  size_t sVar4;
  Char *pCVar5;
  RenderDeviceVkImpl *this_00;
  char (*in_RCX) [40];
  char (*in_R8) [119];
  undefined1 local_b8 [8];
  string msg_2;
  string msg_1;
  string msg;
  string _msg_1;
  undefined1 local_30 [8];
  string _msg;
  DeviceContextVkImpl *this_local;
  
  _msg.field_2._8_8_ = this;
  if ((this->m_State).NumCommands != 0) {
    bVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                      ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
    if (bVar2) {
      _msg_1.field_2._M_local_buf[0xf] =
           (char)DeviceContextBase<Diligent::EngineVkImplTraits>::GetContextId
                           ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
      FormatString<char[53],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[119]>
                ((string *)local_30,
                 (Diligent *)"There are outstanding commands in deferred context #",
                 (char (*) [53])((long)&_msg_1.field_2 + 0xf),
                 (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)
                 " being destroyed, which indicates that FinishCommandList() has not been called. This may cause synchronization issues."
                 ,in_R8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar3,0);
      }
      std::__cxx11::string::~string((string *)local_30);
    }
    else {
      FormatString<char[126],char[40]>
                ((string *)((long)&msg.field_2 + 8),
                 (Diligent *)
                 "There are outstanding commands in the immediate context being destroyed, which indicates the context has not been Flush()\'ed."
                 ,(char (*) [126])0xe4e106,in_RCX);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar3,0);
      }
      std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
    }
  }
  bVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  if (!bVar2) {
    Flush(this);
  }
  FinishFrame(this);
  sVar4 = VulkanUploadHeap::GetStalePagesCount(&this->m_UploadHeap);
  if (sVar4 != 0) {
    FormatString<char[70]>
              ((string *)((long)&msg_1.field_2 + 8),
               (char (*) [70])
               "All allocated upload heap pages must have been released at this point");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"~DeviceContextVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9d);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  sVar4 = VulkanDynamicHeap::GetAllocatedMasterBlockCount(&this->m_DynamicHeap);
  if (sVar4 != 0) {
    FormatString<char[65]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [65])"All allocated dynamic heap master blocks must have been released");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"~DeviceContextVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9e);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  sVar4 = DynamicDescriptorSetAllocator::GetAllocatedPoolCount(&this->m_DynamicDescrSetAllocator);
  if (sVar4 != 0) {
    FormatString<char[81]>
              ((string *)local_b8,
               (char (*) [81])
               "All allocated dynamic descriptor set pools must have been released at this point");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"~DeviceContextVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9f);
    std::__cxx11::string::~string((string *)local_b8);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_QueueFamilyCmdPools);
  if (bVar2) {
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                        (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<std::unique_ptr<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,std::default_delete<VulkanUtilities::VulkanCommandBufferPool>>[],std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,std::default_delete<VulkanUtilities::VulkanCommandBufferPool>>[]>>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)this_00,&this->m_QueueFamilyCmdPools,0xffffffffffffffff);
  }
  VulkanUtilities::VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::
  ~VulkanObjectWrapper(&this->m_ASQueryPool);
  std::vector<VkClearValue,_std::allocator<VkClearValue>_>::~vector(&this->m_vkClearValues);
  RefCntAutoPtr<Diligent::BufferVkImpl>::~RefCntAutoPtr(&this->m_DummyVB);
  DynamicDescriptorSetAllocator::~DynamicDescriptorSetAllocator(&this->m_DynamicDescrSetAllocator);
  VulkanDynamicHeap::~VulkanDynamicHeap(&this->m_DynamicHeap);
  VulkanUploadHeap::~VulkanUploadHeap(&this->m_UploadHeap);
  std::
  unique_ptr<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[],_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
  ::~unique_ptr(&this->m_QueueFamilyCmdPools);
  std::
  vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
  ::~vector(&this->m_MappedBuffers);
  std::
  unordered_map<Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture,_Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,_std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,_std::allocator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>_>
  ::~unordered_map(&this->m_MappedTextures);
  std::
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  ::~vector(&this->m_WaitFences);
  std::
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  ::~vector(&this->m_SignalFences);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            (&this->m_SignalSemaphoreValues);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_WaitSemaphoreValues);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_WaitDstStageMasks);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::~vector
            (&this->m_VkSignalSemaphores);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::~vector(&this->m_VkWaitSemaphores)
  ;
  std::
  vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
  ::~vector(&this->m_WaitRecycledSemaphores);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::~vector(&this->m_SignalManagedSemaphores);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::~vector(&this->m_WaitManagedSemaphores);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_CmdListAllocator);
  std::
  unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  ::~unique_ptr(&this->m_DynamicRenderingInfo);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_DynamicBufferOffsets);
  std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL>::~array(&this->m_BindInfo);
  VulkanUtilities::VulkanCommandBuffer::~VulkanCommandBuffer(&this->m_CommandBuffer);
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::~DeviceContextNextGenBase
            (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

DeviceContextVkImpl::~DeviceContextVkImpl()
{
    if (m_State.NumCommands != 0)
    {
        if (IsDeferred())
        {
            LOG_ERROR_MESSAGE("There are outstanding commands in deferred context #", GetContextId(),
                              " being destroyed, which indicates that FinishCommandList() has not been called."
                              " This may cause synchronization issues.");
        }
        else
        {
            LOG_ERROR_MESSAGE("There are outstanding commands in the immediate context being destroyed, "
                              "which indicates the context has not been Flush()'ed.",
                              " This may cause synchronization issues.");
        }
    }

    if (!IsDeferred())
    {
        Flush();
    }

    // For deferred contexts, m_SubmittedBuffersCmdQueueMask is reset to 0 after every call to FinishFrame().
    // In this case there are no resources to release, so there will be no issues.
    FinishFrame();

    // There must be no stale resources
    // clang-format off
    DEV_CHECK_ERR(m_UploadHeap.GetStalePagesCount()                  == 0, "All allocated upload heap pages must have been released at this point");
    DEV_CHECK_ERR(m_DynamicHeap.GetAllocatedMasterBlockCount()       == 0, "All allocated dynamic heap master blocks must have been released");
    DEV_CHECK_ERR(m_DynamicDescrSetAllocator.GetAllocatedPoolCount() == 0, "All allocated dynamic descriptor set pools must have been released at this point");
    // clang-format on

    // NB: If there are any command buffers in the release queue, they will always be returned to the pool
    //     before the pool itself is released because the pool will always end up later in the queue,
    //     so we do not need to idle the GPU.
    //     Also note that command buffers are disposed directly into the release queue, but
    //     the command pool goes into the stale objects queue and is moved into the release queue
    //     when the next command buffer is submitted.
    if (m_QueueFamilyCmdPools)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_QueueFamilyCmdPools), ~Uint64{0});

    // NB: Upload heap, dynamic heap and dynamic descriptor manager return their resources to
    //     global managers and do not need to wait for GPU to idle.
}